

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O0

void xmlXPtrEndPointFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  int *piVar1;
  int *piVar2;
  xmlNodePtr node_00;
  int indx;
  xmlXPathObjectPtr pxVar3;
  xmlLocationSetPtr val;
  xmlNodePtr node;
  int i;
  xmlLocationSetPtr oldset;
  xmlLocationSetPtr newset;
  xmlXPathObjectPtr point;
  xmlXPathObjectPtr obj;
  xmlXPathObjectPtr tmp;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (nargs == 1) {
      if (ctxt->valueNr < ctxt->valueFrame + 1) {
        xmlXPathErr(ctxt,0x17);
      }
      else if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
              ((ctxt->value->type != XPATH_LOCATIONSET && (ctxt->value->type != XPATH_NODESET)))) {
        xmlXPathErr(ctxt,0xb);
      }
      else {
        pxVar3 = valuePop(ctxt);
        point = pxVar3;
        if (pxVar3->type == XPATH_NODESET) {
          point = xmlXPtrNewLocationSetNodeSet(pxVar3->nodesetval);
          xmlXPathFreeObject(pxVar3);
          if (point == (xmlXPathObjectPtr)0x0) {
            xmlXPathErr(ctxt,0xf);
            return;
          }
        }
        val = xmlXPtrLocationSetCreate((xmlXPathObjectPtr)0x0);
        if (val == (xmlLocationSetPtr)0x0) {
          xmlXPathFreeObject(point);
          xmlXPathErr(ctxt,0xf);
        }
        else {
          piVar1 = (int *)point->user;
          if (piVar1 != (int *)0x0) {
            for (node._4_4_ = 0; node._4_4_ < *piVar1; node._4_4_ = node._4_4_ + 1) {
              piVar2 = *(int **)(*(long *)(piVar1 + 2) + (long)node._4_4_ * 8);
              if (piVar2 != (int *)0x0) {
                newset = (xmlLocationSetPtr)0x0;
                if (*piVar2 == 5) {
                  newset = (xmlLocationSetPtr)
                           xmlXPtrNewPoint(*(xmlNodePtr *)(piVar2 + 10),piVar2[0xc]);
                }
                else if (*piVar2 == 6) {
                  node_00 = *(xmlNodePtr *)(piVar2 + 0xe);
                  if (node_00 == (xmlNodePtr)0x0) {
                    if (*(long *)(piVar2 + 10) == 0) {
                      indx = xmlXPtrNbLocChildren((xmlNodePtr)0x0);
                      newset = (xmlLocationSetPtr)xmlXPtrNewPoint((xmlNodePtr)0x0,indx);
                    }
                  }
                  else {
                    if ((node_00->type == XML_ATTRIBUTE_NODE) ||
                       (node_00->type == XML_NAMESPACE_DECL)) {
                      xmlXPathFreeObject(point);
                      xmlXPtrFreeLocationSet(val);
                      xmlXPathErr(ctxt,0x10);
                      return;
                    }
                    newset = (xmlLocationSetPtr)xmlXPtrNewPoint(node_00,piVar2[0x10]);
                  }
                }
                if (newset != (xmlLocationSetPtr)0x0) {
                  xmlXPtrLocationSetAdd(val,(xmlXPathObjectPtr)newset);
                }
              }
            }
          }
          xmlXPathFreeObject(point);
          pxVar3 = xmlXPtrWrapLocationSet(val);
          valuePush(ctxt,pxVar3);
        }
      }
    }
    else {
      xmlXPathErr(ctxt,0xc);
    }
  }
  return;
}

Assistant:

static void
xmlXPtrEndPointFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr tmp, obj, point;
    xmlLocationSetPtr newset = NULL;
    xmlLocationSetPtr oldset = NULL;

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_LOCATIONSET) &&
	 (ctxt->value->type != XPATH_NODESET)))
        XP_ERROR(XPATH_INVALID_TYPE)

    obj = valuePop(ctxt);
    if (obj->type == XPATH_NODESET) {
	/*
	 * First convert to a location set
	 */
	tmp = xmlXPtrNewLocationSetNodeSet(obj->nodesetval);
	xmlXPathFreeObject(obj);
	if (tmp == NULL)
            XP_ERROR(XPATH_MEMORY_ERROR)
	obj = tmp;
    }

    newset = xmlXPtrLocationSetCreate(NULL);
    if (newset == NULL) {
	xmlXPathFreeObject(obj);
        XP_ERROR(XPATH_MEMORY_ERROR);
    }
    oldset = (xmlLocationSetPtr) obj->user;
    if (oldset != NULL) {
	int i;

	for (i = 0; i < oldset->locNr; i++) {
	    tmp = oldset->locTab[i];
	    if (tmp == NULL)
		continue;
	    point = NULL;
	    switch (tmp->type) {
		case XPATH_POINT:
		    point = xmlXPtrNewPoint(tmp->user, tmp->index);
		    break;
		case XPATH_RANGE: {
		    xmlNodePtr node = tmp->user2;
		    if (node != NULL) {
			if ((node->type == XML_ATTRIBUTE_NODE) ||
                            (node->type == XML_NAMESPACE_DECL)) {
			    xmlXPathFreeObject(obj);
			    xmlXPtrFreeLocationSet(newset);
			    XP_ERROR(XPTR_SYNTAX_ERROR);
			}
			point = xmlXPtrNewPoint(node, tmp->index2);
		    } else if (tmp->user == NULL) {
			point = xmlXPtrNewPoint(node,
				       xmlXPtrNbLocChildren(node));
		    }
		    break;
	        }
		default:
		    /*** Should we raise an error ?
		    xmlXPathFreeObject(obj);
		    xmlXPathFreeObject(newset);
		    XP_ERROR(XPATH_INVALID_TYPE)
		    ***/
		    break;
	    }
            if (point != NULL)
		xmlXPtrLocationSetAdd(newset, point);
	}
    }
    xmlXPathFreeObject(obj);
    valuePush(ctxt, xmlXPtrWrapLocationSet(newset));
}